

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::ProcessHeadersMessage
          (PeerManagerImpl *this,CNode *pfrom,Peer *peer,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers,bool via_compact_block)

{
  size_type *psVar1;
  uchar *puVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  pointer pCVar5;
  HeadersSyncState *pHVar6;
  ChainstateManager *pCVar7;
  pointer ppCVar8;
  pointer pCVar9;
  NodeId NVar10;
  uint256 *puVar11;
  string_view source_file;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  base_blob<256U> *pbVar14;
  mutex_type *pmVar15;
  bool bVar16;
  int i;
  int iVar17;
  uchar *puVar18;
  CBlockIndex *pCVar19;
  CBlockIndex *pCVar20;
  CBlockIndex *pCVar21;
  Chainstate *pCVar22;
  long lVar23;
  HeadersSyncState *this_00;
  Logger *pLVar24;
  _Base_ptr p_Var25;
  int64_t iVar26;
  optional<arith_uint256> *b;
  size_type sVar27;
  ulong uVar28;
  _Base_ptr p_Var29;
  string *message;
  string *message_00;
  _Rb_tree_header *p_Var30;
  mutex_type *pmVar31;
  undefined8 uVar32;
  undefined1 *puVar33;
  _Alloc_hider _Var34;
  pointer pCVar35;
  long lVar36;
  _Base_ptr *pp_Var37;
  CBlockHeader *header;
  pointer pCVar38;
  long in_FS_OFFSET;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  span<const_CBlockHeader,_18446744073709551615UL> headers_00;
  span<const_CBlockHeader,_18446744073709551615UL> headers_01;
  string_view str;
  string_view logging_function_06;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  pVar42;
  long *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  CNode *pCVar43;
  CNode *node;
  CBlockIndex *pindexLast;
  NodeId local_188 [2];
  BlockValidationState state;
  string local_128;
  uint256 local_108;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  undefined1 local_d8 [16];
  vector<CInv,_std::allocator<CInv>_> vGetData;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock64;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock68;
  undefined1 local_78 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar38 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar5 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar36 = (long)pCVar38 - (long)pCVar5;
  if (pCVar38 == pCVar5) {
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &peer->m_headers_sync_mutex;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&state);
    if ((peer->m_headers_sync)._M_t.
        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
        super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl != (HeadersSyncState *)0x0) {
      std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 &peer->m_headers_sync,(pointer)0x0);
      criticalblock68.super_unique_lock._M_device = &(this->m_headers_presync_mutex).super_mutex;
      criticalblock68.super_unique_lock._8_8_ =
           criticalblock68.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock(&criticalblock68.super_unique_lock);
      criticalblock61.super_unique_lock._M_device = (mutex_type *)pfrom->id;
      pVar42 = std::
               _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
               ::equal_range(&(this->m_headers_presync_stats)._M_t,
                             (key_type_conflict *)&criticalblock61);
      std::
      _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::_M_erase_aux(&(this->m_headers_presync_stats)._M_t,(_Base_ptr)pVar42.first._M_node,
                     (_Base_ptr)pVar42.second._M_node);
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock68.super_unique_lock);
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    goto LAB_001e6d53;
  }
  bVar16 = HasValidProofOfWork(headers,&this->m_chainparams->consensus);
  if (bVar16) {
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
         (undefined1  [16])0x0;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    auVar40 = (undefined1  [16])state.super_ValidationState<BlockValidationResult>._0_16_;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    pCVar38 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar16 = pCVar38 == pCVar5;
    if (!bVar16) {
      puVar2 = (uchar *)((long)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                field_2 + 8);
      bVar16 = false;
      do {
        state.super_ValidationState<BlockValidationResult>._0_16_ = auVar40;
        puVar18 = std::
                  __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                            (&state,puVar2);
        _Var34._M_p = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p;
        if (puVar18 != puVar2) {
          auVar41[0] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10] ==
                        (uchar)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                               _M_string_length);
          auVar41[1] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._1_1_);
          auVar41[2] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._2_1_);
          auVar41[3] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._3_1_);
          auVar41[4] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._4_1_);
          auVar41[5] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._5_1_);
          auVar41[6] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._6_1_);
          auVar41[7] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length._7_1_);
          auVar41[8] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                        _M_local_buf[0]);
          auVar41[9] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                        _M_local_buf[1]);
          auVar41[10] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                         _M_local_buf[2]);
          auVar41[0xb] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[3]);
          auVar41[0xc] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[4]);
          auVar41[0xd] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[5]);
          auVar41[0xe] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[6]);
          auVar41[0xf] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2
                          ._M_local_buf[7]);
          auVar40[0] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] ==
                        (undefined1)state.super_ValidationState<BlockValidationResult>.m_mode);
          auVar40[1] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._1_1_);
          auVar40[2] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._2_1_);
          auVar40[3] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] ==
                        state.super_ValidationState<BlockValidationResult>.m_mode._3_1_);
          auVar40[4] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4] ==
                        (undefined1)state.super_ValidationState<BlockValidationResult>.m_result);
          auVar40[5] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._1_1_);
          auVar40[6] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._2_1_);
          auVar40[7] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7] ==
                        state.super_ValidationState<BlockValidationResult>.m_result._3_1_);
          auVar40[8] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8] ==
                        (uchar)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                               _M_dataplus._M_p);
          auVar40[9] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9] ==
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p._1_1_);
          auVar40[10] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10] ==
                         state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_dataplus._M_p._2_1_);
          auVar40[0xb] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._3_1_);
          auVar40[0xc] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._4_1_);
          auVar40[0xd] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._5_1_);
          auVar40[0xe] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._6_1_);
          auVar40[0xf] = -((pCVar38->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf] ==
                          state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                          _M_dataplus._M_p._7_1_);
          auVar40 = auVar40 & auVar41;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
               _Var34._M_p;
          if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) != 0xffff) break;
        }
        CBlockHeader::GetHash((uint256 *)&criticalblock68,pCVar38);
        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = local_78._8_8_;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             local_78._0_8_;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)criticalblock68.super_unique_lock._8_8_;
        state.super_ValidationState<BlockValidationResult>._0_8_ =
             criticalblock68.super_unique_lock._M_device;
        auVar40 = (undefined1  [16])state.super_ValidationState<BlockValidationResult>._0_16_;
        pCVar38 = pCVar38 + 1;
        bVar16 = pCVar38 == pCVar5;
      } while (!bVar16);
    }
    if (!bVar16) {
      state.super_ValidationState<BlockValidationResult>._0_8_ =
           &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
      criticalblock68.super_unique_lock._M_device = (mutex_type *)0x1f;
      state.super_ValidationState<BlockValidationResult>._0_8_ =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                     (size_type *)&criticalblock68,0);
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           (size_type)criticalblock68.super_unique_lock._M_device;
      builtin_strncpy((char *)state.super_ValidationState<BlockValidationResult>._0_8_,
                      "non-continuous headers sequence",0x1f);
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)criticalblock68.super_unique_lock._M_device;
      *(char *)(state.super_ValidationState<BlockValidationResult>._0_8_ +
               (long)criticalblock68.super_unique_lock._M_device) = '\0';
      Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message_00);
      goto LAB_001e6d3c;
    }
    pindexLast = (CBlockIndex *)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &peer->m_headers_sync_mutex;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&state);
    bVar16 = IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
    pCVar38 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pHVar6 = (peer->m_headers_sync)._M_t.
             super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
             super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
             super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&state);
    if (pCVar38 == pCVar5) goto LAB_001e6d53;
    state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0xb43050);
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
    pCVar19 = ::node::BlockManager::LookupBlockIndex
                        (&this->m_chainman->m_blockman,
                         &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>
                           )._M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    if (pCVar19 == (CBlockIndex *)0x0) {
      state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0xb43050);
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
      pCVar19 = this->m_chainman->m_best_header;
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&state);
      GetLocator((CBlockLocator *)&state,pCVar19);
      bVar16 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&state,peer);
      if (state.super_ValidationState<BlockValidationResult>._0_8_ != 0) {
        operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_string_length - state.super_ValidationState<BlockValidationResult>._0_8_)
        ;
      }
      if (bVar16) {
        pLVar24 = LogInstance();
        bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
        if (bVar16) {
          CBlockHeader::GetHash
                    (&local_108,
                     (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                     _M_impl.super__Vector_impl_data._M_start);
          base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock65,&local_108);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_128,
                     &((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                       _M_impl.super__Vector_impl_data._M_start)->hashPrevBlock);
          local_188[0] = pfrom->id;
          pLVar24 = LogInstance();
          bVar16 = BCLog::Logger::Enabled(pLVar24);
          if (bVar16) {
            psVar1 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                      _M_string_length;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)0x0;
            state.super_ValidationState<BlockValidationResult>._0_8_ = psVar1;
            auVar12[0xf] = 0;
            auVar12._0_15_ =
                 (undefined1  [15])
                 state.super_ValidationState<BlockValidationResult>.m_reject_reason._9_15_;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ = auVar12 << 8
            ;
            tinyformat::format<std::__cxx11::string,std::__cxx11::string,int,long>
                      ((string *)&criticalblock68,
                       (tinyformat *)
                       "received header %s: missing prev block %s, sending getheaders (%d) to end (peer=%d)\n"
                       ,(char *)&criticalblock65,&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pCVar19->nHeight,(int *)local_188,(long *)in_stack_fffffffffffffe28);
            _GLOBAL__N_1::PeerManagerImpl::ProcessHeadersMessage();
            pLVar24 = LogInstance();
            criticalblock61.super_unique_lock._M_device = (mutex_type *)0x5b;
            criticalblock61.super_unique_lock._8_8_ = anon_var_dwarf_2793a8;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file._M_len = 0x5b;
            str._M_str = (char *)state.super_ValidationState<BlockValidationResult>._0_8_;
            str._M_len = (size_t)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                                 _M_dataplus._M_p;
            logging_function_06._M_str = "HandleUnconnectingHeaders";
            logging_function_06._M_len = 0x19;
            BCLog::Logger::LogPrintStr(pLVar24,str,logging_function_06,source_file,0xacd,NET,Debug);
            if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ != psVar1) {
              operator_delete((void *)state.super_ValidationState<BlockValidationResult>._0_8_,
                              state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                              _M_string_length + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if (criticalblock65.super_unique_lock._M_device != (mutex_type *)local_d8) {
            operator_delete(criticalblock65.super_unique_lock._M_device,local_d8._0_8_ + 1);
          }
        }
      }
      criticalblock61.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock61.super_unique_lock._8_8_ =
           criticalblock61.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock61.super_unique_lock);
      NVar10 = pfrom->id;
      CBlockHeader::GetHash
                ((uint256 *)&state,
                 (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      UpdateBlockAvailability(this,NVar10,(uint256 *)&state);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock61.super_unique_lock);
      goto LAB_001e6d53;
    }
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
    criticalblock68.super_unique_lock._M_device = (mutex_type *)&cs_main;
    criticalblock68.super_unique_lock._8_8_ =
         criticalblock68.super_unique_lock._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    pCVar7 = this->m_chainman;
    CBlockHeader::GetHash
              ((uint256 *)&state,
               (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1);
    pCVar20 = ::node::BlockManager::LookupBlockIndex(&pCVar7->m_blockman,(uint256 *)&state);
    if (pCVar20 == (CBlockIndex *)0x0) {
      bVar39 = false;
    }
    else {
      pCVar21 = this->m_chainman->m_best_header;
      if ((pCVar21 == (CBlockIndex *)0x0) ||
         (pCVar21 = CBlockIndex::GetAncestor(pCVar21,pCVar20->nHeight), pCVar21 != pCVar20)) {
        pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar17 = pCVar20->nHeight;
        if (((long)iVar17 < 0) ||
           (ppCVar8 = (pCVar22->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (int)((ulong)((long)(pCVar22->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8) >> 3) <=
           iVar17)) {
          pCVar21 = (CBlockIndex *)0x0;
        }
        else {
          pCVar21 = ppCVar8[iVar17];
        }
        bVar39 = pCVar21 == pCVar20;
      }
      else {
        bVar39 = true;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&criticalblock68);
    if ((!bVar16 && !bVar39) && ((pfrom->m_permission_flags & NoBan) != NoBan)) {
      pCVar9 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_start;
      headers_00._M_extent._M_extent_value =
           ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl
                  .super__Vector_impl_data._M_finish - (long)pCVar9 >> 4) * -0x3333333333333333;
      headers_00._M_ptr = pCVar9;
      CalculateClaimedHeadersWork((arith_uint256 *)&criticalblock61,headers_00);
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
           *(undefined1 (*) [16])((pCVar19->nChainWork).super_base_uint<256U>.pn + 4);
      state.super_ValidationState<BlockValidationResult>._0_16_ =
           *(undefined1 (*) [16])(pCVar19->nChainWork).super_base_uint<256U>.pn;
      lVar23 = 0;
      uVar28 = 0;
      do {
        uVar28 = (ulong)*(uint *)((long)&criticalblock61.super_unique_lock._M_device + lVar23 * 4) +
                 (&state.super_ValidationState<BlockValidationResult>.m_mode)[lVar23] + uVar28;
        (&state.super_ValidationState<BlockValidationResult>.m_mode)[lVar23] = (ModeState)uVar28;
        uVar28 = uVar28 >> 0x20;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 8);
      local_78._0_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
      local_78._8_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity;
      criticalblock68.super_unique_lock._M_device =
           (mutex_type *)state.super_ValidationState<BlockValidationResult>._0_8_;
      criticalblock68.super_unique_lock._8_8_ =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p;
      GetAntiDoSWorkThreshold((arith_uint256 *)&criticalblock61,this);
      iVar17 = base_uint<256U>::CompareTo
                         ((base_uint<256U> *)&criticalblock68,(base_uint<256U> *)&criticalblock61);
      if (iVar17 < 0) {
        if ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl
                  .super__Vector_impl_data._M_start == 160000) {
          criticalblock64.super_unique_lock._M_owns = false;
          criticalblock64.super_unique_lock._M_device = &(peer->m_headers_sync_mutex).super_mutex;
          std::unique_lock<std::mutex>::lock(&criticalblock64.super_unique_lock);
          this_00 = (HeadersSyncState *)operator_new(0x1e8);
          pCVar43 = pfrom;
          HeadersSyncState::HeadersSyncState
                    (this_00,peer->m_id,&this->m_chainparams->consensus,pCVar19,
                     (arith_uint256 *)&criticalblock61);
          std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
                    ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                     &peer->m_headers_sync,this_00);
          IsContinuationOfLowWorkHeadersSync(this,peer,pfrom,headers);
          std::unique_lock<std::mutex>::~unique_lock(&criticalblock64.super_unique_lock);
          pfrom = pCVar43;
        }
        else {
          pLVar24 = LogInstance();
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
          if (bVar16) {
            criticalblock64.super_unique_lock._M_device =
                 (mutex_type *)
                 (((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 +
                 (long)pCVar19->nHeight);
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)pfrom->id;
            logging_function._M_str = "TryLowWorkHeadersSync";
            logging_function._M_len = 0x15;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_00._M_len = 0x5b;
            LogPrintf_<unsigned_long,long>
                      (logging_function,source_file_00,0xb56,
                       IPC|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ZMQ|BENCH|HTTP|TOR,
                       (Level)&criticalblock64,(char *)&vGetData,
                       (unsigned_long *)in_stack_fffffffffffffe28,(long *)pfrom);
          }
        }
        std::vector<CBlockHeader,std::allocator<CBlockHeader>>::_M_assign_aux<CBlockHeader_const*>
                  ((vector<CBlockHeader,std::allocator<CBlockHeader>> *)headers,0,0);
        if (iVar17 < 0) goto LAB_001e6d53;
      }
    }
    auVar13._8_8_ = 0;
    auVar13._0_8_ = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>._0_16_ = auVar13 << 0x40;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_9_ = ZEXT89(0);
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    pCVar9 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_start;
    headers_01._M_extent._M_extent_value =
         ((long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pCVar9 >> 4) * -0x3333333333333333;
    headers_01._M_ptr = pCVar9;
    bVar16 = ChainstateManager::ProcessNewBlockHeaders
                       (this->m_chainman,headers_01,true,&state,&pindexLast);
    if (bVar16 || state.super_ValidationState<BlockValidationResult>.m_mode != M_INVALID) {
      if (pindexLast == (CBlockIndex *)0x0) {
        __assert_fail("pindexLast",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                      ,0xc78,
                      "void (anonymous namespace)::PeerManagerImpl::ProcessHeadersMessage(CNode &, Peer &, std::vector<CBlockHeader> &&, bool)"
                     );
      }
      pCVar43 = pfrom;
      if (lVar36 == 160000 && (pCVar38 == pCVar5 || pHVar6 == (HeadersSyncState *)0x0)) {
        GetLocator((CBlockLocator *)&criticalblock68,pindexLast);
        bVar16 = MaybeSendGetHeaders(this,pfrom,(CBlockLocator *)&criticalblock68,peer);
        if (criticalblock68.super_unique_lock._M_device != (mutex_type *)0x0) {
          operator_delete(criticalblock68.super_unique_lock._M_device,
                          local_78._0_8_ - (long)criticalblock68.super_unique_lock._M_device);
        }
        if (bVar16) {
          pLVar24 = LogInstance();
          args_1 = (long *)0x1e724a;
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
          if (bVar16) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)pfrom->id;
            logging_function_00._M_str = "ProcessHeadersMessage";
            logging_function_00._M_len = 0x15;
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_01._M_len = 0x5b;
            LogPrintf_<int,long,std::atomic<int>>
                      (logging_function_00,source_file_01,0xc7f,
                       IPC|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|RPC|WALLETDB|ZMQ|BENCH|NET,
                       (Level)&pindexLast->nHeight,(char *)&criticalblock68,
                       (int *)&peer->m_starting_height,args_1,
                       (atomic<int> *)in_stack_fffffffffffffe28);
          }
        }
      }
      pCVar19 = pindexLast;
      criticalblock61.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock61.super_unique_lock._8_8_ =
           criticalblock61.super_unique_lock._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock61.super_unique_lock);
      NVar10 = pfrom->id;
      p_Var3 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
      p_Var29 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var25 = &p_Var3->_M_header;
      for (; p_Var29 != (_Base_ptr)0x0;
          p_Var29 = (&p_Var29->_M_left)[*(long *)(p_Var29 + 1) < NVar10]) {
        if (NVar10 <= *(long *)(p_Var29 + 1)) {
          p_Var25 = p_Var29;
        }
      }
      p_Var29 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var25 != p_Var3) &&
         (p_Var29 = p_Var25, NVar10 < *(long *)(p_Var25 + 1))) {
        p_Var29 = &p_Var3->_M_header;
      }
      pp_Var37 = (_Base_ptr *)0x0;
      if ((_Rb_tree_header *)p_Var29 != p_Var3) {
        pp_Var37 = &p_Var29[1]._M_parent;
      }
      puVar11 = pCVar19->phashBlock;
      if (puVar11 == (uint256 *)0x0) {
LAB_001e7e1e:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      criticalblock68.super_unique_lock._M_device =
           *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
      pbVar14 = &puVar11->super_base_blob<256U>;
      criticalblock68.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
      criticalblock68.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
      criticalblock68.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
      criticalblock68.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
      criticalblock68.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
      criticalblock68.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
      criticalblock68.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
      criticalblock68.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
      local_78._0_8_ = *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_78._8_8_ = *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x18);
      UpdateBlockAvailability(this,NVar10,(uint256 *)&criticalblock68);
      if (pCVar20 == (CBlockIndex *)0x0) {
        pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar17 = base_uint<256U>::CompareTo
                           (&(pCVar19->nChainWork).super_base_uint<256U>,
                            &((pCVar22->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>);
        if (0 < iVar17) {
          iVar26 = GetTime();
          pp_Var37[0x11] = (_Base_ptr)iVar26;
        }
      }
      bVar16 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
      node = pCVar43;
      if ((bVar16 && lVar36 != 160000) && (p_Var29 = *pp_Var37, p_Var29 != (_Base_ptr)0x0)) {
        b = inline_assertion_check<true,std::optional<arith_uint256>const&>
                      (&(this->m_chainman->m_options).minimum_chain_work,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                       ,0x3d9,"MinimumChainWork","m_options.minimum_chain_work");
        iVar17 = base_uint<256U>::CompareTo
                           ((base_uint<256U> *)&p_Var29[1]._M_parent,(base_uint<256U> *)b);
        node = pCVar43;
        if (iVar17 < 0) {
          if (ADDR_FETCH < pCVar43->m_conn_type) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h"
                          ,0x301,"bool CNode::IsOutboundOrBlockRelayConn() const");
          }
          if ((0x2dU >> (pCVar43->m_conn_type & 0x1f) & 1) == 0) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)pCVar43->id;
            logging_function_01._M_str = "UpdatePeerStateForReceivedHeaders";
            logging_function_01._M_len = 0x21;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_02._M_len = 0x5b;
            LogPrintf_<long>(logging_function_01,source_file_02,0xbe1,ALL,Info,
                             "Disconnecting outbound peer %d -- headers chain has insufficient work\n"
                             ,(long *)&criticalblock68);
            LOCK();
            (pCVar43->fDisconnect)._M_base._M_i = true;
            UNLOCK();
          }
        }
      }
      if ((((((node->fDisconnect)._M_base._M_i & 1U) == 0) &&
           (node->m_conn_type == OUTBOUND_FULL_RELAY)) &&
          (p_Var29 = *pp_Var37, p_Var29 != (_Base_ptr)0x0)) &&
         (this->m_outbound_peers_with_protect_from_disconnect < 4)) {
        pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar17 = base_uint<256U>::CompareTo
                           ((base_uint<256U> *)&p_Var29[1]._M_parent,
                            &((pCVar22->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>);
        if ((-1 < iVar17) && (*(char *)((long)pp_Var37 + 0x81) == '\0')) {
          pLVar24 = LogInstance();
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
          if (bVar16) {
            criticalblock68.super_unique_lock._M_device = (mutex_type *)node->id;
            logging_function_02._M_str = "UpdatePeerStateForReceivedHeaders";
            logging_function_02._M_len = 0x21;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
            ;
            source_file_03._M_len = 0x5b;
            LogPrintf_<long>(logging_function_02,source_file_03,0xbee,NET,Debug,
                             "Protecting outbound peer=%d from eviction\n",(long *)&criticalblock68)
            ;
          }
          *(undefined1 *)((long)pp_Var37 + 0x81) = 1;
          this->m_outbound_peers_with_protect_from_disconnect =
               this->m_outbound_peers_with_protect_from_disconnect + 1;
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock61.super_unique_lock);
      pCVar19 = pindexLast;
      criticalblock65.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
      criticalblock65.super_unique_lock._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock65.super_unique_lock);
      lVar36 = node->id;
      p_Var29 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var25 = &p_Var3->_M_header;
      for (; (_Rb_tree_header *)p_Var29 != (_Rb_tree_header *)0x0;
          p_Var29 = (&p_Var29->_M_left)[(long)*(size_t *)(p_Var29 + 1) < lVar36]) {
        if (lVar36 <= (long)*(size_t *)(p_Var29 + 1)) {
          p_Var25 = p_Var29;
        }
      }
      p_Var30 = p_Var3;
      if (((_Rb_tree_header *)p_Var25 != p_Var3) &&
         (p_Var30 = (_Rb_tree_header *)p_Var25,
         lVar36 < (long)((_Rb_tree_header *)p_Var25)->_M_node_count)) {
        p_Var30 = p_Var3;
      }
      puVar33 = (undefined1 *)0x0;
      if (p_Var30 != p_Var3) {
        puVar33 = (undefined1 *)(p_Var30 + 1);
      }
      bVar16 = CanDirectFetch(this);
      if ((bVar16) && ((pCVar19->nStatus & 6) != 0 && (pCVar19->nStatus & 0x60) == 0)) {
        pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
        iVar17 = base_uint<256U>::CompareTo
                           (&((pCVar22->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1]->nChainWork).
                             super_base_uint<256U>,&(pCVar19->nChainWork).super_base_uint<256U>);
        if (iVar17 < 1) {
          criticalblock64.super_unique_lock._M_device = (mutex_type *)0x0;
          criticalblock64.super_unique_lock._M_owns = false;
          criticalblock64.super_unique_lock._9_7_ = 0;
          local_108.super_base_blob<256U>.m_data._M_elems._0_8_ = pCVar19;
          do {
            pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
            iVar17 = *(int *)(local_108.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x18);
            if (((long)iVar17 < 0) ||
               (ppCVar8 = (pCVar22->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
               (int)((ulong)((long)(pCVar22->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8) >> 3)
               <= iVar17)) {
              pCVar20 = (CBlockIndex *)0x0;
            }
            else {
              pCVar20 = ppCVar8[iVar17];
            }
            if (pCVar20 == (CBlockIndex *)local_108.super_base_blob<256U>.m_data._M_elems._0_8_)
            break;
            if (0x80 < (ulong)(criticalblock64.super_unique_lock._8_8_ -
                              (long)criticalblock64.super_unique_lock._M_device)) break;
            if ((*(uint32_t *)(local_108.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x58) & 8) ==
                0) {
              puVar11 = *(uint256 **)local_108.super_base_blob<256U>.m_data._M_elems._0_8_;
              if (puVar11 == (uint256 *)0x0) goto LAB_001e7e1e;
              criticalblock68.super_unique_lock._M_device =
                   *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
              pbVar14 = &puVar11->super_base_blob<256U>;
              criticalblock68.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
              criticalblock68.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
              criticalblock68.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
              criticalblock68.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
              criticalblock68.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
              criticalblock68.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
              criticalblock68.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
              criticalblock68.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
              local_78._0_8_ =
                   *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x10);
              local_78._8_8_ =
                   *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x18);
              sVar27 = std::
                       multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                       ::count(&this->mapBlocksInFlight,(key_type *)&criticalblock68);
              if ((sVar27 == 0) &&
                 ((iVar17 < (((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight ||
                  (((peer->m_their_services)._M_i & NODE_WITNESS) != NODE_NONE)))) {
                if (criticalblock64.super_unique_lock._8_8_ == 0) {
                  std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
                  _M_realloc_insert<CBlockIndex_const*const&>
                            ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)
                             &criticalblock64,(iterator)0x0,(CBlockIndex **)&local_108);
                }
                else {
                  *(undefined8 *)criticalblock64.super_unique_lock._8_8_ =
                       local_108.super_base_blob<256U>.m_data._M_elems._0_8_;
                  criticalblock64.super_unique_lock._8_8_ =
                       criticalblock64.super_unique_lock._8_8_ + 8;
                }
              }
            }
            local_108.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(CBlockIndex **)(local_108.super_base_blob<256U>.m_data._M_elems._0_8_ + 8);
          } while ((CBlockIndex *)local_108.super_base_blob<256U>.m_data._M_elems._0_8_ !=
                   (CBlockIndex *)0x0);
          pCVar22 = ChainstateManager::ActiveChainstate(this->m_chainman);
          iVar17 = *(int *)(local_108.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x18);
          if (((long)iVar17 < 0) ||
             (ppCVar8 = (pCVar22->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
             (int)((ulong)((long)(pCVar22->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar8) >> 3) <=
             iVar17)) {
            pCVar20 = (CBlockIndex *)0x0;
          }
          else {
            pCVar20 = ppCVar8[iVar17];
          }
          if (pCVar20 == (CBlockIndex *)local_108.super_base_blob<256U>.m_data._M_elems._0_8_) {
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_start = (pointer)0x0;
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_finish = (pointer)0x0;
            vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage = (pointer)0x0;
            pmVar15 = criticalblock64.super_unique_lock._M_device;
            pmVar31 = (mutex_type *)criticalblock64.super_unique_lock._8_8_;
            while ((pmVar31 != pmVar15 && (*(ulong *)(puVar33 + 0x58) < 0x10))) {
              pCVar20 = (CBlockIndex *)pmVar31[-1].super___mutex_base._M_mutex.__data.__list.__next;
              criticalblock61.super_unique_lock._M_device =
                   (mutex_type *)
                   (CONCAT44(criticalblock61.super_unique_lock._M_device._4_4_,
                             ((uint)(peer->m_their_services)._M_i & 8) << 0x1b) | 2);
              puVar11 = pCVar20->phashBlock;
              if (puVar11 == (uint256 *)0x0) goto LAB_001e7e1e;
              criticalblock68.super_unique_lock._M_device =
                   *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
              pbVar14 = &puVar11->super_base_blob<256U>;
              criticalblock68.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
              criticalblock68.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
              criticalblock68.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
              criticalblock68.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
              criticalblock68.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
              criticalblock68.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
              criticalblock68.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
              criticalblock68.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
              local_78._0_8_ =
                   *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x10);
              local_78._8_8_ =
                   *(undefined8 *)((puVar11->super_base_blob<256U>).m_data._M_elems + 0x18);
              std::vector<CInv,std::allocator<CInv>>::emplace_back<unsigned_int,uint256>
                        ((vector<CInv,std::allocator<CInv>> *)&vGetData,(uint *)&criticalblock61,
                         (uint256 *)&criticalblock68);
              BlockRequested(this,node->id,pCVar20,(iterator **)0x0);
              pLVar24 = LogInstance();
              bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
              if (bVar16) {
                puVar11 = pCVar20->phashBlock;
                if (puVar11 == (uint256 *)0x0) goto LAB_001e7e1e;
                criticalblock61.super_unique_lock._M_device =
                     *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
                pbVar14 = &puVar11->super_base_blob<256U>;
                criticalblock61.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
                criticalblock61.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
                criticalblock61.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
                criticalblock61.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
                criticalblock61.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
                criticalblock61.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
                criticalblock61.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
                criticalblock61.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
                base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock68,&criticalblock61);
                local_128._M_dataplus._M_p = (pointer)node->id;
                logging_function_04._M_str = "HeadersDirectFetchBlocks";
                logging_function_04._M_len = 0x18;
                source_file_05._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                ;
                source_file_05._M_len = 0x5b;
                LogPrintf_<std::__cxx11::string,long>
                          (logging_function_04,source_file_05,0xba7,NET,Debug,
                           "Requesting block %s from  peer=%d\n",(string *)&criticalblock68,
                           (long *)&local_128);
                if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                  operator_delete(criticalblock68.super_unique_lock._M_device,
                                  (ulong)(local_78._0_8_ + 1));
                }
              }
              pmVar31 = (mutex_type *)((long)&pmVar31[-1].super___mutex_base._M_mutex + 0x20);
            }
            if (1 < (ulong)(((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7)) {
              pCVar43 = node;
              pLVar24 = LogInstance();
              bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
              if (bVar16) {
                puVar11 = pCVar19->phashBlock;
                if (puVar11 == (uint256 *)0x0) goto LAB_001e7e1e;
                criticalblock61.super_unique_lock._M_device =
                     *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
                pbVar14 = &puVar11->super_base_blob<256U>;
                criticalblock61.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
                criticalblock61.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
                criticalblock61.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
                criticalblock61.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
                criticalblock61.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
                criticalblock61.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
                criticalblock61.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
                criticalblock61.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
                base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock68,&criticalblock61);
                logging_function_05._M_str = "HeadersDirectFetchBlocks";
                logging_function_05._M_len = 0x18;
                source_file_06._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                ;
                source_file_06._M_len = 0x5b;
                LogPrintf_<std::__cxx11::string,int>
                          (logging_function_05,source_file_06,0xbac,
                           IPC|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC|BENCH|
                           MEMPOOL|TOR|NET,(Level)(string *)&criticalblock68,
                           (char *)&pCVar19->nHeight,in_stack_fffffffffffffe28,(int *)pCVar43);
                if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                  operator_delete(criticalblock68.super_unique_lock._M_device,
                                  (ulong)(local_78._0_8_ + 1));
                }
              }
            }
            if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_start) {
              if (((((this->m_opts).ignore_incoming_txs == false) &&
                   ((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                          super__Vector_impl_data._M_start == 0x24)) && (puVar33[0x6a] != '\0')) &&
                 (((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1
                  && ((pCVar19->pprev->nStatus & 100) == 4)))) {
                CInv::CInv((CInv *)&criticalblock68,4,
                           &(vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_start)->hash);
                *(undefined4 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0x1c) = local_78._16_4_;
                *(undefined8 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0xc) = local_78._0_8_;
                *(undefined8 *)
                 (((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                    super__Vector_impl_data._M_start)->hash).super_base_blob<256U>.m_data._M_elems +
                 0x14) = local_78._8_8_;
                *(mutex_type **)
                 vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                 super__Vector_impl_data._M_start = criticalblock68.super_unique_lock._M_device;
                pbVar14 = &((vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                             super__Vector_impl_data._M_start)->hash).super_base_blob<256U>;
                (pbVar14->m_data)._M_elems[4] = criticalblock68.super_unique_lock._M_owns;
                (pbVar14->m_data)._M_elems[5] = criticalblock68.super_unique_lock._9_1_;
                (pbVar14->m_data)._M_elems[6] = criticalblock68.super_unique_lock._10_1_;
                (pbVar14->m_data)._M_elems[7] = criticalblock68.super_unique_lock._11_1_;
                (pbVar14->m_data)._M_elems[8] = criticalblock68.super_unique_lock._12_1_;
                (pbVar14->m_data)._M_elems[9] = criticalblock68.super_unique_lock._13_1_;
                (pbVar14->m_data)._M_elems[10] = criticalblock68.super_unique_lock._14_1_;
                (pbVar14->m_data)._M_elems[0xb] = criticalblock68.super_unique_lock._15_1_;
              }
              criticalblock68.super_unique_lock._M_owns = true;
              criticalblock68.super_unique_lock._9_7_ = 0;
              local_78._0_8_ = (pointer)0x61746164746567;
              criticalblock68.super_unique_lock._M_device = (mutex_type *)local_78;
              (anonymous_namespace)::PeerManagerImpl::
              MakeAndPushMessage<std::vector<CInv,std::allocator<CInv>>&>
                        ((PeerManagerImpl *)this,node,(string *)&criticalblock68,&vGetData);
              if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                operator_delete(criticalblock68.super_unique_lock._M_device,
                                (ulong)(local_78._0_8_ + 1));
              }
            }
            if (vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              puVar33 = (undefined1 *)
                        ((long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage -
                        (long)vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                              super__Vector_impl_data._M_start);
              pCVar35 = vGetData.super__Vector_base<CInv,_std::allocator<CInv>_>._M_impl.
                        super__Vector_impl_data._M_start;
LAB_001e7c2d:
              operator_delete(pCVar35,(ulong)puVar33);
            }
          }
          else {
            pLVar24 = LogInstance();
            bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar24,NET,Debug);
            if (bVar16) {
              puVar11 = pCVar19->phashBlock;
              if (puVar11 == (uint256 *)0x0) goto LAB_001e7e1e;
              criticalblock61.super_unique_lock._M_device =
                   *(mutex_type **)(puVar11->super_base_blob<256U>).m_data._M_elems;
              pbVar14 = &puVar11->super_base_blob<256U>;
              criticalblock61.super_unique_lock._M_owns = (bool)(pbVar14->m_data)._M_elems[8];
              criticalblock61.super_unique_lock._9_1_ = (pbVar14->m_data)._M_elems[9];
              criticalblock61.super_unique_lock._10_1_ = (pbVar14->m_data)._M_elems[10];
              criticalblock61.super_unique_lock._11_1_ = (pbVar14->m_data)._M_elems[0xb];
              criticalblock61.super_unique_lock._12_1_ = (pbVar14->m_data)._M_elems[0xc];
              criticalblock61.super_unique_lock._13_1_ = (pbVar14->m_data)._M_elems[0xd];
              criticalblock61.super_unique_lock._14_1_ = (pbVar14->m_data)._M_elems[0xe];
              criticalblock61.super_unique_lock._15_1_ = (pbVar14->m_data)._M_elems[0xf];
              base_blob<256u>::ToString_abi_cxx11_((string *)&criticalblock68,&criticalblock61);
              logging_function_03._M_str = "HeadersDirectFetchBlocks";
              logging_function_03._M_len = 0x18;
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
              ;
              source_file_04._M_len = 0x5b;
              LogPrintf_<std::__cxx11::string,int>
                        (logging_function_03,source_file_04,0xb9a,
                         IPC|MEMPOOLREJ|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|
                         HTTP,(Level)(string *)&criticalblock68,(char *)&pCVar19->nHeight,
                         in_stack_fffffffffffffe28,(int *)node);
              if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
                puVar33 = (undefined1 *)(local_78._0_8_ + 1);
                pCVar35 = (pointer)criticalblock68.super_unique_lock._M_device;
                goto LAB_001e7c2d;
              }
            }
          }
          if (criticalblock64.super_unique_lock._M_device != (mutex_type *)0x0) {
            operator_delete(criticalblock64.super_unique_lock._M_device,
                            -(long)criticalblock64.super_unique_lock._M_device);
          }
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock65.super_unique_lock);
    }
    else {
      NVar10 = pfrom->id;
      criticalblock68.super_unique_lock._M_device = (mutex_type *)local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&criticalblock68,"invalid header received","");
      MaybePunishNodeForBlock(this,NVar10,&state,via_compact_block,(string *)&criticalblock68);
      if (criticalblock68.super_unique_lock._M_device != (mutex_type *)local_78) {
        operator_delete(criticalblock68.super_unique_lock._M_device,(ulong)(local_78._0_8_ + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p ==
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2)
    goto LAB_001e6d53;
    uVar32 = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
             _M_allocated_capacity;
    _Var34._M_p = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus.
                  _M_p;
  }
  else {
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    criticalblock68.super_unique_lock._M_device = (mutex_type *)0x21;
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
                    (size_type *)&criticalblock68,0);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)criticalblock68.super_unique_lock._M_device;
    builtin_strncpy((char *)state.super_ValidationState<BlockValidationResult>._0_8_,
                    "header with invalid proof of work",0x21);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)criticalblock68.super_unique_lock._M_device;
    *(char *)(state.super_ValidationState<BlockValidationResult>._0_8_ +
             (long)criticalblock68.super_unique_lock._M_device) = '\0';
    Misbehaving((PeerManagerImpl *)peer,(Peer *)&state,message);
LAB_001e6d3c:
    if ((size_type *)state.super_ValidationState<BlockValidationResult>._0_8_ ==
        &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length)
    goto LAB_001e6d53;
    uVar32 = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    _Var34._M_p = (pointer)state.super_ValidationState<BlockValidationResult>._0_8_;
  }
  operator_delete(_Var34._M_p,uVar32 + 1);
LAB_001e6d53:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessHeadersMessage(CNode& pfrom, Peer& peer,
                                            std::vector<CBlockHeader>&& headers,
                                            bool via_compact_block)
{
    size_t nCount = headers.size();

    if (nCount == 0) {
        // Nothing interesting. Stop asking this peers for more headers.
        // If we were in the middle of headers sync, receiving an empty headers
        // message suggests that the peer suddenly has nothing to give us
        // (perhaps it reorged to our chain). Clear download state for this peer.
        LOCK(peer.m_headers_sync_mutex);
        if (peer.m_headers_sync) {
            peer.m_headers_sync.reset(nullptr);
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        }
        // A headers message with no headers cannot be an announcement, so assume
        // it is a response to our last getheaders request, if there is one.
        peer.m_last_getheaders_timestamp = {};
        return;
    }

    // Before we do any processing, make sure these pass basic sanity checks.
    // We'll rely on headers having valid proof-of-work further down, as an
    // anti-DoS criteria (note: this check is required before passing any
    // headers into HeadersSyncState).
    if (!CheckHeadersPoW(headers, m_chainparams.GetConsensus(), peer)) {
        // Misbehaving() calls are handled within CheckHeadersPoW(), so we can
        // just return. (Note that even if a header is announced via compact
        // block, the header itself should be valid, so this type of error can
        // always be punished.)
        return;
    }

    const CBlockIndex *pindexLast = nullptr;

    // We'll set already_validated_work to true if these headers are
    // successfully processed as part of a low-work headers sync in progress
    // (either in PRESYNC or REDOWNLOAD phase).
    // If true, this will mean that any headers returned to us (ie during
    // REDOWNLOAD) can be validated without further anti-DoS checks.
    bool already_validated_work = false;

    // If we're in the middle of headers sync, let it do its magic.
    bool have_headers_sync = false;
    {
        LOCK(peer.m_headers_sync_mutex);

        already_validated_work = IsContinuationOfLowWorkHeadersSync(peer, pfrom, headers);

        // The headers we passed in may have been:
        // - untouched, perhaps if no headers-sync was in progress, or some
        //   failure occurred
        // - erased, such as if the headers were successfully processed and no
        //   additional headers processing needs to take place (such as if we
        //   are still in PRESYNC)
        // - replaced with headers that are now ready for validation, such as
        //   during the REDOWNLOAD phase of a low-work headers sync.
        // So just check whether we still have headers that we need to process,
        // or not.
        if (headers.empty()) {
            return;
        }

        have_headers_sync = !!peer.m_headers_sync;
    }

    // Do these headers connect to something in our block index?
    const CBlockIndex *chain_start_header{WITH_LOCK(::cs_main, return m_chainman.m_blockman.LookupBlockIndex(headers[0].hashPrevBlock))};
    bool headers_connect_blockindex{chain_start_header != nullptr};

    if (!headers_connect_blockindex) {
        // This could be a BIP 130 block announcement, use
        // special logic for handling headers that don't connect, as this
        // could be benign.
        HandleUnconnectingHeaders(pfrom, peer, headers);
        return;
    }

    // If headers connect, assume that this is in response to any outstanding getheaders
    // request we may have sent, and clear out the time of our last request. Non-connecting
    // headers cannot be a response to a getheaders request.
    peer.m_last_getheaders_timestamp = {};

    // If the headers we received are already in memory and an ancestor of
    // m_best_header or our tip, skip anti-DoS checks. These headers will not
    // use any more memory (and we are not leaking information that could be
    // used to fingerprint us).
    const CBlockIndex *last_received_header{nullptr};
    {
        LOCK(cs_main);
        last_received_header = m_chainman.m_blockman.LookupBlockIndex(headers.back().GetHash());
        if (IsAncestorOfBestHeaderOrTip(last_received_header)) {
            already_validated_work = true;
        }
    }

    // If our peer has NetPermissionFlags::NoBan privileges, then bypass our
    // anti-DoS logic (this saves bandwidth when we connect to a trusted peer
    // on startup).
    if (pfrom.HasPermission(NetPermissionFlags::NoBan)) {
        already_validated_work = true;
    }

    // At this point, the headers connect to something in our block index.
    // Do anti-DoS checks to determine if we should process or store for later
    // processing.
    if (!already_validated_work && TryLowWorkHeadersSync(peer, pfrom,
                chain_start_header, headers)) {
        // If we successfully started a low-work headers sync, then there
        // should be no headers to process any further.
        Assume(headers.empty());
        return;
    }

    // At this point, we have a set of headers with sufficient work on them
    // which can be processed.

    // If we don't have the last header, then this peer will have given us
    // something new (if these headers are valid).
    bool received_new_header{last_received_header == nullptr};

    // Now process all the headers.
    BlockValidationState state;
    if (!m_chainman.ProcessNewBlockHeaders(headers, /*min_pow_checked=*/true, state, &pindexLast)) {
        if (state.IsInvalid()) {
            MaybePunishNodeForBlock(pfrom.GetId(), state, via_compact_block, "invalid header received");
            return;
        }
    }
    assert(pindexLast);

    // Consider fetching more headers if we are not using our headers-sync mechanism.
    if (nCount == MAX_HEADERS_RESULTS && !have_headers_sync) {
        // Headers message had its maximum size; the peer may have more headers.
        if (MaybeSendGetHeaders(pfrom, GetLocator(pindexLast), peer)) {
            LogDebug(BCLog::NET, "more getheaders (%d) to end to peer=%d (startheight:%d)\n",
                    pindexLast->nHeight, pfrom.GetId(), peer.m_starting_height);
        }
    }

    UpdatePeerStateForReceivedHeaders(pfrom, peer, *pindexLast, received_new_header, nCount == MAX_HEADERS_RESULTS);

    // Consider immediately downloading blocks.
    HeadersDirectFetchBlocks(pfrom, peer, *pindexLast);

    return;
}